

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O3

int64_t pick_interinter_seg(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1,
                           int16_t *residual1,int16_t *diff10,uint64_t *best_sse)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint uVar4;
  MB_MODE_INFO *pMVar5;
  DIFFWTD_MASK_TYPE DVar6;
  bool bVar7;
  int iVar8;
  uint64_t uVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  undefined7 in_register_00000011;
  long lVar13;
  DIFFWTD_MASK_TYPE DVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  uint8_t *puVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dist_by_sse_norm_f;
  double rate_f;
  uint8_t seg_mask [32768];
  
  uVar19 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar19];
  iVar15 = 1 << (bVar1 & 0x1f);
  uVar4 = ((x->e_mbd).cur_buf)->flags;
  bVar11 = 0;
  if ((uVar4 & 8) != 0) {
    bVar11 = (char)(x->e_mbd).bd * '\x02' - 0x10;
  }
  pMVar5 = *(x->e_mbd).mi;
  uVar2 = block_size_wide[uVar19];
  uVar3 = block_size_high[uVar19];
  puVar18 = (x->e_mbd).seg_mask;
  dVar20 = (double)iVar15;
  lVar16 = 0x7fffffffffffffff;
  DVar14 = '\0';
  DVar6 = '\0';
  bVar7 = true;
  do {
    bVar17 = bVar7;
    iVar8 = (int)uVar2;
    if ((uVar4 & 8) == 0) {
      (*av1_build_compound_diffwtd_mask)(puVar18,DVar14,p0,iVar8,p1,iVar8,(int)uVar3,iVar8);
    }
    else {
      (*av1_build_compound_diffwtd_mask_highbd)
                (puVar18,DVar14,(uint8_t *)((ulong)p0 >> 1),iVar8,(uint8_t *)((ulong)p1 >> 1),iVar8,
                 (int)uVar3,iVar8,(x->e_mbd).bd);
    }
    uVar9 = (*av1_wedge_sse_from_residuals)(residual1,diff10,puVar18,iVar15);
    uVar19 = uVar9 + (long)((1 << (bVar11 & 0x1f)) >> 1) >> (bVar11 & 0x3f);
    bVar12 = 3;
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar12 = (char)(x->e_mbd).bd - 5;
    }
    if (uVar19 == 0) {
      lVar10 = 0;
      lVar13 = 0;
    }
    else {
      iVar8 = (int)x->plane[0].dequant_QTX[1] >> (bVar12 & 0x1f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      dVar21 = (double)(long)uVar19 / dVar20;
      dVar22 = log2(dVar21 / ((double)iVar8 * (double)iVar8));
      av1_model_rd_curvfit(bsize,dVar21,dVar22,&rate_f,&dist_by_sse_norm_f);
      dVar22 = 0.0;
      if (0.0 <= rate_f * dVar20) {
        dVar22 = rate_f * dVar20;
      }
      if ((int)(dVar22 + 0.5) == 0) {
        lVar10 = 0;
        lVar13 = uVar19 << 4;
      }
      else {
        dVar23 = dVar21 * dist_by_sse_norm_f * dVar20;
        dVar21 = 0.0;
        if (0.0 <= dVar23) {
          dVar21 = dVar23;
        }
        lVar13 = (long)(dVar21 + 0.5);
        lVar10 = (long)(int)(dVar22 + 0.5);
        if ((long)(uVar19 * 0x800) <= lVar13 * 0x80 + (x->rdmult * lVar10 + 0x100 >> 9)) {
          lVar10 = 0;
          lVar13 = uVar19 << 4;
        }
      }
      lVar13 = lVar13 << 7;
    }
    lVar13 = (x->rdmult * lVar10 + 0x100 >> 9) + lVar13;
    if (lVar13 < lVar16) {
      *best_sse = uVar19;
      lVar16 = lVar13;
      DVar6 = DVar14;
    }
    DVar14 = '\x01';
    puVar18 = seg_mask;
    bVar7 = false;
  } while (bVar17);
  (pMVar5->interinter_comp).mask_type = DVar6;
  if (DVar6 == '\x01') {
    memcpy((x->e_mbd).seg_mask,seg_mask,(long)(2 << (bVar1 & 0x1f)));
  }
  return lVar16;
}

Assistant:

static int64_t pick_interinter_seg(const AV1_COMP *const cpi,
                                   MACROBLOCK *const x, const BLOCK_SIZE bsize,
                                   const uint8_t *const p0,
                                   const uint8_t *const p1,
                                   const int16_t *const residual1,
                                   const int16_t *const diff10,
                                   uint64_t *best_sse) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int N = 1 << num_pels_log2_lookup[bsize];
  int rate;
  int64_t dist;
  DIFFWTD_MASK_TYPE cur_mask_type;
  int64_t best_rd = INT64_MAX;
  DIFFWTD_MASK_TYPE best_mask_type = 0;
  const int hbd = is_cur_buf_hbd(xd);
  const int bd_round = hbd ? (xd->bd - 8) * 2 : 0;
  DECLARE_ALIGNED(16, uint8_t, seg_mask[2 * MAX_SB_SQUARE]);
  uint8_t *tmp_mask[2] = { xd->seg_mask, seg_mask };
  // try each mask type and its inverse
  for (cur_mask_type = 0; cur_mask_type < DIFFWTD_MASK_TYPES; cur_mask_type++) {
    // build mask and inverse
#if CONFIG_AV1_HIGHBITDEPTH
    if (hbd)
      av1_build_compound_diffwtd_mask_highbd(
          tmp_mask[cur_mask_type], cur_mask_type, CONVERT_TO_BYTEPTR(p0), bw,
          CONVERT_TO_BYTEPTR(p1), bw, bh, bw, xd->bd);
    else
      av1_build_compound_diffwtd_mask(tmp_mask[cur_mask_type], cur_mask_type,
                                      p0, bw, p1, bw, bh, bw);
#else
    (void)hbd;
    av1_build_compound_diffwtd_mask(tmp_mask[cur_mask_type], cur_mask_type, p0,
                                    bw, p1, bw, bh, bw);
#endif  // CONFIG_AV1_HIGHBITDEPTH

    // compute rd for mask
    uint64_t sse = av1_wedge_sse_from_residuals(residual1, diff10,
                                                tmp_mask[cur_mask_type], N);
    sse = ROUND_POWER_OF_TWO(sse, bd_round);

    model_rd_sse_fn[MODELRD_TYPE_MASKED_COMPOUND](cpi, x, bsize, 0, sse, N,
                                                  &rate, &dist);
    const int64_t rd0 = RDCOST(x->rdmult, rate, dist);

    if (rd0 < best_rd) {
      best_mask_type = cur_mask_type;
      best_rd = rd0;
      *best_sse = sse;
    }
  }
  mbmi->interinter_comp.mask_type = best_mask_type;
  if (best_mask_type == DIFFWTD_38_INV) {
    memcpy(xd->seg_mask, seg_mask, N * 2);
  }
  return best_rd;
}